

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManDemiterDual(Gia_Man_t *p,Gia_Man_t **pp0,Gia_Man_t **pp1)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint uVar6;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  uint uVar12;
  uint fOdd;
  long lVar13;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x11e8,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("Gia_ManCoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x11e9,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  fOdd = 0;
  *pp1 = (Gia_Man_t *)0x0;
  *pp0 = (Gia_Man_t *)0x0;
  bVar5 = true;
  do {
    __ptr = Gia_ManCollectReach(p,fOdd);
    p_00 = Gia_ManStart(p->vCos->nSize / 2 + p->vCis->nSize + __ptr->nSize + 1);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pName = pcVar8;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pSpec = pcVar8;
    p->pObjs->Value = 0;
    pVVar9 = p->vCis;
    uVar11 = (ulong)(uint)pVVar9->nSize;
    if (p->nRegs < pVVar9->nSize) {
      lVar13 = 0;
      do {
        if ((int)uVar11 <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar9->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5eee;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar11 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar11 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar11 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001f5f0d:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001f5f0d;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
        lVar13 = lVar13 + 1;
        pVVar9 = p->vCis;
        uVar11 = (ulong)pVVar9->nSize;
      } while (lVar13 < (long)(uVar11 - (long)p->nRegs));
    }
    if (0 < __ptr->nSize) {
      lVar13 = 0;
      do {
        iVar1 = __ptr->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5eee;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar11 = *(ulong *)pGVar3;
        if (((int)pGVar3[-(ulong)((uint)uVar11 & 0x1fffffff)].Value < 0) ||
           (uVar6 = (uint)(uVar11 >> 0x20), (int)pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value < 0))
        goto LAB_001f5f2c;
        uVar6 = Gia_ManAppendAnd(p_00,(uint)(uVar11 >> 0x1d) & 1 ^
                                      pGVar3[-(ulong)((uint)uVar11 & 0x1fffffff)].Value,
                                 pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
        pGVar3->Value = uVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < __ptr->nSize);
    }
    pVVar9 = p->vCos;
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        iVar1 = pVVar9->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001f5eee:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (((uint)lVar13 & 1) == fOdd) {
          pGVar3 = p->pObjs + iVar1;
          uVar12 = (uint)*(undefined8 *)pGVar3;
          uVar6 = pGVar3[-(ulong)(uVar12 & 0x1fffffff)].Value;
          if ((int)uVar6 < 0) {
LAB_001f5f2c:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,uVar12 >> 0x1d & 1 ^ uVar6);
          pVVar9 = p->vCos;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar9->nSize);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (!bVar5) {
      *pp1 = p_00;
      return 1;
    }
    *pp0 = p_00;
    fOdd = 1;
    bVar5 = false;
  } while( true );
}

Assistant:

int Gia_ManDemiterDual( Gia_Man_t * p, Gia_Man_t ** pp0, Gia_Man_t ** pp1 )
{
    Gia_Obj_t * pObj;
    int i, fOdd;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) % 2 == 0 );
    *pp0 = *pp1 = NULL;
    for ( fOdd = 0; fOdd < 2; fOdd++ )
    {
        Vec_Int_t * vNodes = Gia_ManCollectReach( p, fOdd );
        Gia_Man_t * pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Gia_ManCoNum(p)/2 );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManConst0(p)->Value = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachObjVec( vNodes, p, pObj, i )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            if ( (i & 1) == fOdd )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Vec_IntFree( vNodes );
        if ( fOdd )
            *pp1 = pNew;
        else
            *pp0 = pNew;
    }
    return 1;
}